

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O3

ssize_t __thiscall
duckdb_parquet::BloomFilterHeader::read
          (BloomFilterHeader *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ssize_t sVar5;
  _func_int **pp_Var6;
  undefined8 *puVar7;
  ushort *__nbytes_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  int16_t fid;
  TType ftype;
  string fname;
  ushort local_86;
  undefined4 local_84;
  undefined4 local_80;
  undefined4 local_7c;
  undefined4 local_78;
  int local_74;
  BloomFilterAlgorithm *local_70;
  BloomFilterHash *local_68;
  BloomFilterCompression *local_60;
  int32_t *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  duckdb_apache::thrift::protocol::TProtocol::incrementInputRecursionDepth(this_00);
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  iVar1 = (*this_00->_vptr_TProtocol[0x19])(this_00,&local_50);
  local_60 = &this->compression;
  local_68 = &this->hash;
  local_70 = &this->algorithm;
  local_58 = &this->numBytes;
  local_78 = 0;
  local_80 = 0;
  local_7c = 0;
  local_84 = 0;
  do {
    __nbytes_00 = &local_86;
    iVar2 = (*this_00->_vptr_TProtocol[0x1b])(this_00,&local_50,&local_74);
    if (local_74 == 0) {
      iVar3 = (*this_00->_vptr_TProtocol[0x1a])(this_00);
      if (((byte)local_7c & (byte)local_84 & (byte)local_78 & (byte)local_80 & 1) == 0) {
        puVar7 = (undefined8 *)__cxa_allocate_exception(0x30);
        puVar7[1] = puVar7 + 3;
        puVar7[2] = 0;
        *(undefined1 *)(puVar7 + 3) = 0;
        *puVar7 = &PTR__TException_00499898;
        *(undefined4 *)(puVar7 + 5) = 1;
        __cxa_throw(puVar7,&duckdb_apache::thrift::protocol::TProtocolException::typeinfo,
                    duckdb_apache::thrift::TException::~TException);
      }
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      this_00->input_recursion_depth_ = this_00->input_recursion_depth_ - 1;
      return (ulong)(uint)(iVar3 + iVar2 + iVar1);
    }
    switch(local_86) {
    case 1:
      pp_Var6 = this_00->_vptr_TProtocol;
      if (local_74 != 8) goto LAB_002cc355;
      iVar3 = (*pp_Var6[0x27])(this_00,local_58);
      local_78 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
      goto LAB_002cc361;
    case 2:
      if (local_74 == 0xc) {
        sVar5 = BloomFilterAlgorithm::read(local_70,__fd,__buf_00,(size_t)__nbytes_00);
        iVar3 = (int)sVar5;
        local_80 = (undefined4)CONCAT71((int7)((ulong)sVar5 >> 8),1);
        goto LAB_002cc361;
      }
      break;
    case 3:
      if (local_74 == 0xc) {
        sVar5 = BloomFilterHash::read(local_68,__fd,__buf_00,(size_t)__nbytes_00);
        iVar3 = (int)sVar5;
        local_7c = (undefined4)CONCAT71((int7)((ulong)sVar5 >> 8),1);
        goto LAB_002cc361;
      }
      break;
    case 4:
      if (local_74 == 0xc) {
        sVar5 = BloomFilterCompression::read(local_60,__fd,__buf_00,(size_t)__nbytes_00);
        iVar3 = (int)sVar5;
        local_84 = (undefined4)CONCAT71((int7)((ulong)sVar5 >> 8),1);
        goto LAB_002cc361;
      }
    }
    pp_Var6 = this_00->_vptr_TProtocol;
LAB_002cc355:
    iVar3 = (*pp_Var6[0x2c])(this_00);
LAB_002cc361:
    iVar4 = (*this_00->_vptr_TProtocol[0x1c])(this_00);
    iVar1 = iVar3 + iVar2 + iVar1 + iVar4;
  } while( true );
}

Assistant:

uint32_t BloomFilterHeader::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;

  bool isset_numBytes = false;
  bool isset_algorithm = false;
  bool isset_hash = false;
  bool isset_compression = false;

  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          xfer += iprot->readI32(this->numBytes);
          isset_numBytes = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 2:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->algorithm.read(iprot);
          isset_algorithm = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 3:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->hash.read(iprot);
          isset_hash = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 4:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->compression.read(iprot);
          isset_compression = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  if (!isset_numBytes)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_algorithm)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_hash)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_compression)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  return xfer;
}